

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int P_FindLineSpecial(char *string,int *min_args,int *max_args)

{
  int iVar1;
  int iVar2;
  int lexval;
  int mid;
  int max;
  int min;
  int *max_args_local;
  int *min_args_local;
  char *string_local;
  
  mid = 0;
  lexval = 0xf6;
  while( true ) {
    if (lexval < mid) {
      return 0;
    }
    iVar1 = (mid + lexval) / 2;
    iVar2 = strcasecmp(string,LineSpecialNames[iVar1].name);
    if (iVar2 == 0) break;
    if (iVar2 < 1) {
      lexval = iVar1 + -1;
    }
    else {
      mid = iVar1 + 1;
    }
  }
  if (min_args != (int *)0x0) {
    *min_args = (int)LineSpecialNames[iVar1].min_args;
  }
  if (max_args != (int *)0x0) {
    *max_args = (int)LineSpecialNames[iVar1].max_args;
  }
  return LineSpecialNames[iVar1].number;
}

Assistant:

int P_FindLineSpecial (const char *string, int *min_args, int *max_args)
{
	int min = 0, max = countof(LineSpecialNames) - 1;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		int lexval = stricmp (string, LineSpecialNames[mid].name);
		if (lexval == 0)
		{
			if (min_args != NULL) *min_args = LineSpecialNames[mid].min_args;
			if (max_args != NULL) *max_args = LineSpecialNames[mid].max_args;
			return LineSpecialNames[mid].number;
		}
		else if (lexval > 0)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return 0;
}